

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceGLImpl::CreateDeviceMemory
          (RenderDeviceGLImpl *this,DeviceMemoryCreateInfo *CreateInfo,IDeviceMemory **ppMemory)

{
  string msg;
  string local_30;
  
  FormatString<char[46]>(&local_30,(char (*) [46])"CreateDeviceMemory is not supported in OpenGL");
  DebugAssertionFailed
            (local_30._M_dataplus._M_p,"CreateDeviceMemory",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x282);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *ppMemory = (IDeviceMemory *)0x0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateDeviceMemory(const DeviceMemoryCreateInfo& CreateInfo, IDeviceMemory** ppMemory)
{
    UNSUPPORTED("CreateDeviceMemory is not supported in OpenGL");
    *ppMemory = nullptr;
}